

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_math.cpp
# Opt level: O0

SW_FT_Long SW_FT_MulFix(SW_FT_Long a,SW_FT_Long b)

{
  undefined8 local_28;
  SW_FT_Long c;
  SW_FT_Int s;
  SW_FT_Long b_local;
  SW_FT_Long a_local;
  
  s = 1;
  a_local = a;
  if (a < 0) {
    a_local = -a;
    s = -1;
  }
  b_local = b;
  if (b < 0) {
    b_local = -b;
    s = -s;
  }
  local_28 = a_local * b_local + 0x8000 >> 0x10;
  if (s < 1) {
    local_28 = -local_28;
  }
  return local_28;
}

Assistant:

SW_FT_Long SW_FT_MulFix(SW_FT_Long a, SW_FT_Long b)
{
    SW_FT_Int  s = 1;
    SW_FT_Long c;

    SW_FT_MOVE_SIGN(a, s);
    SW_FT_MOVE_SIGN(b, s);

    c = (SW_FT_Long)(((SW_FT_Int64)a * b + 0x8000L) >> 16);

    return (s > 0) ? c : -c;
}